

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtSat.c
# Opt level: O2

int Cgt_CheckImplication(Cgt_Man_t *p,Aig_Obj_t *pGate,Aig_Obj_t *pMiter)

{
  int *piVar1;
  sat_solver *s;
  uint __line;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  long lVar5;
  char *__assertion;
  int iVar6;
  undefined8 local_38;
  
  iVar2 = p->pPars->nConfMax;
  p->nCalls = p->nCalls + 1;
  if ((p->pSat == (sat_solver *)0x0) || (p->pCnf == (Cnf_Dat_t *)0x0)) {
    __assertion = "p->pSat && p->pCnf";
    __line = 0x36;
  }
  else if (((ulong)pMiter & 1) == 0) {
    if ((Aig_Obj_t *)((ulong)pGate & 0xfffffffffffffffe) != pMiter) {
      piVar1 = p->pCnf->pVarNums;
      local_38 = CONCAT44(piVar1[pMiter->Id] * 2,
                          ((uint)pGate & 1) +
                          piVar1[((Aig_Obj_t *)((ulong)pGate & 0xfffffffffffffffe))->Id] * 2);
      aVar3 = Abc_Clock();
      iVar6 = 0;
      iVar2 = sat_solver_solve(p->pSat,(lit *)&local_38,(lit *)&stack0xffffffffffffffd0,(long)iVar2,
                               0,0,0);
      aVar4 = Abc_Clock();
      p->timeSat = p->timeSat + (aVar4 - aVar3);
      aVar4 = Abc_Clock();
      lVar5 = aVar4 - aVar3;
      if (iVar2 == 1) {
        p->timeSatSat = p->timeSatSat + lVar5;
        p->nCallsSat = p->nCallsSat + 1;
      }
      else if (iVar2 == -1) {
        p->timeSatUnsat = p->timeSatUnsat + lVar5;
        local_38 = local_38 ^ 0x100000001;
        iVar2 = sat_solver_addclause(p->pSat,(lit *)&local_38,(lit *)&stack0xffffffffffffffd0);
        if (iVar2 == 0) {
          __assertion = "RetValue";
          __line = 0x48;
          goto LAB_00421e00;
        }
        s = p->pSat;
        if ((s->qtail != s->qhead) && (iVar2 = sat_solver_simplify(s), iVar2 == 0)) {
          __assert_fail("RetValue != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0x102,"void sat_solver_compress(sat_solver *)");
        }
        p->nCallsUnsat = p->nCallsUnsat + 1;
        iVar6 = 1;
      }
      else {
        p->timeSatUndec = p->timeSatUndec + lVar5;
        p->nCallsUndec = p->nCallsUndec + 1;
        iVar6 = -1;
      }
      return iVar6;
    }
    __assertion = "Aig_Regular(pGate) != pMiter";
    __line = 0x38;
  }
  else {
    __assertion = "!Aig_IsComplement(pMiter)";
    __line = 0x37;
  }
LAB_00421e00:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cgt/cgtSat.c"
                ,__line,"int Cgt_CheckImplication(Cgt_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////


/**Function*************************************************************

  Synopsis    [Runs equivalence test for the two nodes.]

  Description [Both nodes should be regular and different from each other.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Cgt_CheckImplication( Cgt_Man_t * p, Aig_Obj_t * pGate, Aig_Obj_t * pMiter )
{
    int nBTLimit = p->pPars->nConfMax;
    int pLits[2], RetValue;
    abctime clk;
    p->nCalls++;

    // sanity checks
    assert( p->pSat && p->pCnf );
    assert( !Aig_IsComplement(pMiter) );
    assert( Aig_Regular(pGate) != pMiter );

    // solve under assumptions
    // G => !M -- true     G & M -- false
    pLits[0] = toLitCond( p->pCnf->pVarNums[Aig_Regular(pGate)->Id], Aig_IsComplement(pGate) );
    pLits[1] = toLitCond( p->pCnf->pVarNums[pMiter->Id], 0 );

clk = Abc_Clock();
    RetValue = sat_solver_solve( p->pSat, pLits, pLits + 2, (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
p->timeSat += Abc_Clock() - clk;
    if ( RetValue == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        pLits[0] = lit_neg( pLits[0] );
        pLits[1] = lit_neg( pLits[1] );
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
        sat_solver_compress( p->pSat );
        p->nCallsUnsat++;
        return 1;
    }
    else if ( RetValue == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        p->nCallsSat++;
        return 0;
    }
    else // if ( RetValue1 == l_Undef )
    {
p->timeSatUndec += Abc_Clock() - clk;
        p->nCallsUndec++;
        return -1;
    }
    return -2;
}